

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

bool google::protobuf::internal::IsDescendant(Message *root,Message *message)

{
  FieldDescriptor *this;
  pointer ppFVar1;
  bool bVar2;
  int iVar3;
  Descriptor *this_00;
  FieldDescriptor *pFVar4;
  Message *pMVar5;
  Reflection *this_01;
  int index;
  pointer ppFVar6;
  Metadata MVar7;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  MapIterator iter;
  MapIterator end;
  
  MVar7 = Message::GetMetadata(root);
  this_01 = MVar7.reflection;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::ListFields(this_01,root,&fields);
  ppFVar1 = fields.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar6 = fields.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppFVar6 != ppFVar1;
      ppFVar6 = ppFVar6 + 1) {
    this = *ppFVar6;
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this->type_ * 4) == 10) {
      bVar2 = FieldDescriptor::is_repeated(this);
      if (bVar2) {
        bVar2 = FieldDescriptor::is_map(this);
        if (bVar2) {
          this_00 = FieldDescriptor::message_type(this);
          pFVar4 = Descriptor::field(this_00,1);
          if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar4->type_ * 4) == 10) {
            Reflection::MapEnd(&end,this_01,root,this);
            Reflection::MapBegin(&iter,this_01,root,this);
            while( true ) {
              bVar2 = protobuf::operator!=(&iter,&end);
              if (!bVar2) break;
              MapFieldBase::SetMapDirty(iter.map_);
              pMVar5 = MapValueRef::MutableMessageValue(&iter.value_);
              if (pMVar5 == message) goto LAB_001c6dc7;
              bVar2 = IsDescendant(pMVar5,message);
              if (bVar2) goto LAB_001c6dc7;
              MapIterator::operator++(&iter);
            }
          }
        }
        else {
          iVar3 = Reflection::FieldSize(this_01,root,this);
          index = 0;
          if (iVar3 < 1) {
            iVar3 = index;
          }
          while (iVar3 != index) {
            pMVar5 = Reflection::MutableRepeatedMessage(this_01,root,this,index);
            if (pMVar5 == message) goto LAB_001c6dc7;
            bVar2 = IsDescendant(pMVar5,message);
            index = index + 1;
            if (bVar2) goto LAB_001c6dc7;
          }
        }
      }
      else {
        pMVar5 = Reflection::MutableMessage(this_01,root,this,(MessageFactory *)0x0);
        if (pMVar5 == message) break;
        bVar2 = IsDescendant(pMVar5,message);
        if (bVar2) break;
      }
    }
  }
LAB_001c6dc7:
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
  return ppFVar6 != ppFVar1;
}

Assistant:

bool IsDescendant(Message& root, const Message& message) {
  const Reflection* reflection = root.GetReflection();
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(root, &fields);

  for (const auto* field : fields) {
    // Skip non-message fields.
    if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) continue;

    // Optional messages.
    if (!field->is_repeated()) {
      Message* sub_message = reflection->MutableMessage(&root, field);
      if (sub_message == &message || IsDescendant(*sub_message, message)) {
        return true;
      }
      continue;
    }

    // Repeated messages.
    if (!IsMapFieldInApi(field)) {
      int count = reflection->FieldSize(root, field);
      for (int i = 0; i < count; i++) {
        Message* sub_message =
            reflection->MutableRepeatedMessage(&root, field, i);
        if (sub_message == &message || IsDescendant(*sub_message, message)) {
          return true;
        }
      }
      continue;
    }

    // Map field: if accessed as repeated fields, messages are *copied* and
    // matching pointer won't work. Must directly access map.
    constexpr int kValIdx = 1;
    const FieldDescriptor* val_field = field->message_type()->field(kValIdx);
    // Skip map fields whose value type is not message.
    if (val_field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) continue;

    MapIterator end = reflection->MapEnd(&root, field);
    for (auto iter = reflection->MapBegin(&root, field); iter != end; ++iter) {
      Message* sub_message = iter.MutableValueRef()->MutableMessageValue();
      if (sub_message == &message || IsDescendant(*sub_message, message)) {
        return true;
      }
    }
  }

  return false;
}